

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O3

void __thiscall imrt::EvaluationFunction::Zrollback(EvaluationFunction *this)

{
  list<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  *plVar1;
  _List_node_base *p_Var2;
  pointer pvVar3;
  long lVar4;
  _List_node_base *p_Var5;
  long lVar6;
  
  plVar1 = &this->Z_diff;
  p_Var2 = (this->Z_diff).
           super__List_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var2 != (_List_node_base *)plVar1) {
    pvVar3 = (this->Z).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    p_Var5 = p_Var2;
    do {
      lVar6 = (long)*(int *)((long)&p_Var5[1]._M_next + 4);
      lVar4 = *(long *)&pvVar3[*(int *)&p_Var5[1]._M_next].
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
      *(double *)(lVar4 + lVar6 * 8) = *(double *)(lVar4 + lVar6 * 8) - (double)p_Var5[1]._M_prev;
      p_Var5 = p_Var5->_M_next;
    } while (p_Var5 != (_List_node_base *)plVar1);
    while (p_Var2 != (_List_node_base *)plVar1) {
      p_Var5 = p_Var2->_M_next;
      operator_delete(p_Var2);
      p_Var2 = p_Var5;
    }
  }
  (this->Z_diff).
  super__List_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->Z_diff).
  super__List_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->Z_diff).
  super__List_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  ._M_impl._M_node._M_size = 0;
  return;
}

Assistant:

void EvaluationFunction::Zrollback(){
	for(auto z:Z_diff){
		int o=z.first.first;
		int k=z.first.second;
		Z[o][k]-=z.second;
	}
	Z_diff.clear();
}